

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O3

void Col_SortWords(Col_Word *first,Col_Word *last,Col_WordCompareProc *proc,
                  Col_ClientData clientData)

{
  Col_Word CVar1;
  int iVar2;
  Col_Word CVar3;
  Col_Word CVar4;
  Col_Word *pCVar5;
  Col_Word *pCVar6;
  Col_Word *pCVar7;
  Col_Word *local_50;
  long local_48;
  
  if (last <= first) {
    return;
  }
LAB_0010db60:
LAB_0010db6e:
  local_50 = first + -1;
  CVar1 = *last;
  local_48 = 0;
  pCVar6 = local_50;
  pCVar5 = last;
LAB_0010db8b:
  pCVar7 = pCVar6;
  pCVar6 = pCVar7 + 1;
  if (*pCVar6 != CVar1) goto code_r0x0010db96;
  goto LAB_0010dbae;
code_r0x0010db96:
  iVar2 = (*proc)(*pCVar6,CVar1,clientData);
  if (iVar2 < 0) goto LAB_0010db8b;
LAB_0010dbae:
  do {
    pCVar5 = pCVar5 + -1;
    if ((CVar1 == *pCVar5) || (iVar2 = (*proc)(CVar1,*pCVar5,clientData), pCVar5 == first)) break;
  } while (iVar2 < 0);
  if (pCVar5 <= pCVar6) goto LAB_0010dc66;
  CVar4 = *pCVar5;
  *pCVar5 = *pCVar6;
  *pCVar6 = CVar4;
  CVar3 = CVar1;
  if (CVar4 != CVar1) {
    iVar2 = (*proc)(CVar4,CVar1,clientData);
    if (iVar2 != 0) goto LAB_0010dc1b;
    CVar3 = *pCVar6;
  }
  *pCVar6 = local_50[1];
  local_50[1] = CVar3;
  local_50 = local_50 + 1;
LAB_0010dc1b:
  CVar4 = CVar1;
  if (CVar1 != *pCVar5) {
    iVar2 = (*proc)(CVar1,*pCVar5,clientData);
    if (iVar2 != 0) goto LAB_0010db8b;
    CVar4 = *pCVar5;
  }
  CVar3 = *(Col_Word *)((long)last + local_48 + -8);
  *(Col_Word *)((long)last + local_48 + -8) = CVar4;
  local_48 = local_48 + -8;
  *pCVar5 = CVar3;
  goto LAB_0010db8b;
LAB_0010dc66:
  CVar1 = *last;
  *last = *pCVar6;
  *pCVar6 = CVar1;
  pCVar6 = pCVar7;
  for (pCVar5 = first; pCVar5 < local_50; pCVar5 = pCVar5 + 1) {
    CVar1 = *pCVar6;
    *pCVar6 = *pCVar5;
    *pCVar5 = CVar1;
    pCVar6 = pCVar6 + -1;
  }
  pCVar7 = pCVar7 + 2;
  if (local_48 < -8) {
    pCVar5 = last + -1;
    do {
      CVar1 = *pCVar5;
      *pCVar5 = *pCVar7;
      *pCVar7 = CVar1;
      pCVar7 = pCVar7 + 1;
      pCVar5 = pCVar5 + -1;
    } while ((Col_Word *)(local_48 + (long)last) < pCVar5);
  }
  if ((long)last - (long)pCVar7 <= (long)pCVar6 - (long)first) goto LAB_0010dd07;
  Col_SortWords(first,pCVar6,proc,clientData);
  first = pCVar7;
  if (last <= pCVar7) {
    return;
  }
  goto LAB_0010db6e;
LAB_0010dd07:
  Col_SortWords(pCVar7,last,proc,clientData);
  last = pCVar6;
  if (pCVar6 <= first) {
    return;
  }
  goto LAB_0010db60;
}

Assistant:

void
Col_SortWords(
    Col_Word *first,            /*!< First word of array to sort. */
    Col_Word *last,             /*!< Last word of array to sort. */
    Col_WordCompareProc *proc,  /*!< Comparison proc for sorting. */
    Col_ClientData clientData)  /*!< Opaque data passed as is to **proc**. */
{
/*! \cond IGNORE */
    Col_Word *i, *j, *k, *p, *q;
    Col_Word v;

#define SWAP(a, b) {Col_Word tmp=b; b=a; a=tmp;}

    /*
     * Entry point for tail recursive calls.
     */

#define TAIL_RECURSE(_first, _last) \
    first = (_first); last = (_last); goto start;

start:

    if (last <= first) return;
    i = p = first-1; j = q = last;
    v = *last;
    for (;;) {
        /*
         * Move from left to find an element that is not less.
         */

        while (*++i != v && proc(*i, v, clientData) < 0);

        /*
         * Move from right to find an element that is not greater.
         */

        while (v != *--j && proc(v, *j, clientData) < 0) if (j == first) break;

        /*
         * Stop if pointers have crossed.
         */

        if (i >= j) break;

        /*
         * Exchange.
         */

        SWAP(*i, *j);

        /*
         * If left element equal, exchange to left end.
         */

        if (*i == v || proc(*i, v, clientData) == 0) { p++; SWAP(*p, *i); }

        /*
         * If right element equal, exchange to right end.
         */

        if (v == *j || proc(v, *j, clientData) == 0) { q--; SWAP(*j, *q); }
    }
    SWAP(*i, *last); j = i-1; i = i+1;

    /*
     * Swap left equals to center.
     */

    for (k = first; k < p; k++, j--) SWAP(*k, *j);

    /*
     * Swap right equals to center.
     */

    for (k = last-1; k > q; k--, i++) SWAP(*i, *k);

    /*
     * Recurse on smallest subrange and tail call on largest to minimize
     * recursion depth and ensure O(logn) space.
     */

    if (j-first < last-i) {
        /*
         * Left subrange is shorter.
         */

        Col_SortWords(first, j, proc, clientData);
        TAIL_RECURSE(i, last);
    } else {
        /*
         * Right subrange is shorter.
         */

        Col_SortWords(i, last, proc, clientData);
        TAIL_RECURSE(first, j);
    }

#undef TAIL_RECURSE
#undef SWAP
/*! \endcond *//* IGNORE */
}